

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

ON_UserData * __thiscall ON_UserData::operator=(ON_UserData *this,ON_UserData *src)

{
  ON_UserData *src_local;
  ON_UserData *this_local;
  
  if (this != src) {
    ON_Object::operator=(&this->super_ON_Object,&src->super_ON_Object);
    this->m_userdata_copycount = src->m_userdata_copycount;
    memcpy(&this->m_userdata_xform,&src->m_userdata_xform,0x80);
    if ((this->m_userdata_copycount != 0) &&
       (this->m_userdata_copycount = this->m_userdata_copycount + 1, this->m_userdata_copycount == 0
       )) {
      this->m_userdata_copycount = 1;
    }
  }
  return this;
}

Assistant:

ON_UserData& ON_UserData::operator=(const ON_UserData& src)
{
  // 16 January 2004 Dale Lear
  //    Do not copy the m_userdata_uuid, m_application_uuid,
  //    m_userdata_owner, or m_userdata_next values.
  //    The m_userdata_uuid and m_application_uuid are
  //    set when the class is constructed and should not be 
  //    changed.  The m_userdata_owner and m_userdata_next
  //    values are set when the user data is attached
  //    to a parent object.
  if ( this != &src ) 
  {
    ON_Object::operator=(src);
    m_userdata_copycount = src.m_userdata_copycount;
    m_userdata_xform = src.m_userdata_xform;
    if ( 0 != m_userdata_copycount )
    {
      m_userdata_copycount++;
      if ( !m_userdata_copycount )
        m_userdata_copycount = 1;
    }
  }

  return *this;
}